

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  char *pcVar1;
  char *in_RDX;
  string env_var;
  string local_30;
  
  FlagToEnvVar_abi_cxx11_(&local_30,(internal *)flag,in_RDX);
  pcVar1 = getenv(local_30._M_dataplus._M_p);
  if ((pcVar1 != (char *)0x0) && (default_value = true, *pcVar1 == '0')) {
    default_value = pcVar1[1] != '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return default_value;
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
}